

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O0

int ffpkyuj(fitsfile *fptr,char *keyname,ULONGLONG value,char *comm,int *status)

{
  char local_e8 [8];
  char card [81];
  char local_88 [8];
  char valstring [71];
  int *status_local;
  char *comm_local;
  ULONGLONG value_local;
  char *keyname_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    ffu2c(value,local_88,status);
    ffmkky(keyname,local_88,comm,local_e8,status);
    ffprec(fptr,local_e8,status);
    fptr_local._4_4_ = *status;
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffpkyuj( fitsfile *fptr,     /* I - FITS file pointer        */
            const char *keyname,/* I - name of keyword to write */
            ULONGLONG value,     /* I - keyword value            */
            const char *comm,   /* I - keyword comment          */
            int  *status)       /* IO - error status            */
/*
  Write (put) the keyword, value and comment into the FITS header.
  Writes an integer keyword value.
*/
{
    char valstring[FLEN_VALUE];
    char card[FLEN_CARD];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    ffu2c(value, valstring, status);   /* convert to formatted string */
    ffmkky(keyname, valstring, comm, card, status);  /* construct the keyword*/
    ffprec(fptr, card, status);  /* write the keyword*/

    return(*status);
}